

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

int __thiscall
chrono::ChArchiveExplorer::wildcard_compare(ChArchiveExplorer *this,char *wildcard,char *string)

{
  bool bVar1;
  char *local_38;
  char *mp;
  char *cp;
  char *string_local;
  char *wildcard_local;
  ChArchiveExplorer *this_local;
  
  mp = (char *)0x0;
  local_38 = (char *)0x0;
  cp = string;
  string_local = wildcard;
  while( true ) {
    bVar1 = false;
    if (*cp != '\0') {
      bVar1 = *string_local != '*';
    }
    if (!bVar1) break;
    if ((*string_local != *cp) && (*string_local != '?')) {
      return 0;
    }
    string_local = string_local + 1;
    cp = cp + 1;
  }
  while( true ) {
    while( true ) {
      if (*cp == '\0') {
        for (; *string_local == '*'; string_local = string_local + 1) {
        }
        return (uint)((*string_local != '\0' ^ 0xffU) & 1);
      }
      if (*string_local == '*') break;
      if ((*string_local == *cp) || (*string_local == '?')) {
        string_local = string_local + 1;
        cp = cp + 1;
      }
      else {
        string_local = local_38;
        cp = mp;
        mp = mp + 1;
      }
    }
    local_38 = string_local + 1;
    if (string_local[1] == '\0') break;
    mp = cp + 1;
    string_local = local_38;
  }
  return 1;
}

Assistant:

int wildcard_compare(const char* wildcard, const char* string) {
        const char* cp = 0, * mp = 0;

        while ((*string) && (*wildcard != '*')) {
            if ((*wildcard != *string) && (*wildcard != '?')) {
                return 0;
            }
            wildcard++;
            string++;
        }

        while (*string) {
            if (*wildcard == '*') {
                if (!*++wildcard) {
                    return 1;
                }
                mp = wildcard;
                cp = string + 1;
            } else {
                if ((*wildcard == *string) || (*wildcard == '?')) {
                    wildcard++;
                    string++;
                } else {
                    wildcard = mp;
                    string = cp++;
                }
            }
        }

        while (*wildcard == '*') {
            wildcard++;
        }
        return !*wildcard;
    }